

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void format(tagval *args,int numargs)

{
  byte bVar1;
  byte *pbVar2;
  char *x;
  vector<char> s;
  byte local_49;
  vector<char> local_48;
  
  local_48.buf = (char *)0x0;
  local_48.alen = 0;
  local_48.ulen = 0;
  pbVar2 = (byte *)tagval::getstr(args);
  while (bVar1 = *pbVar2, bVar1 != 0) {
    if (bVar1 == 0x25) {
      bVar1 = pbVar2[1];
      pbVar2 = pbVar2 + 2;
      if ((byte)(bVar1 - 0x31) < 9) {
        x = "";
        if ((int)(bVar1 - 0x30) < numargs) {
          x = tagval::getstr(args + (bVar1 - 0x30));
        }
        for (; *x != '\0'; x = x + 1) {
          vector<char>::add(&local_48,x);
        }
      }
      else {
        local_49 = bVar1;
        vector<char>::add(&local_48,(char *)&local_49);
      }
    }
    else {
      local_49 = bVar1;
      vector<char>::add(&local_48,(char *)&local_49);
      pbVar2 = pbVar2 + 1;
    }
  }
  local_49 = 0;
  vector<char>::add(&local_48,(char *)&local_49);
  result(local_48.buf);
  vector<char>::~vector(&local_48);
  return;
}

Assistant:

void format(tagval *args, int numargs)
{
    vector<char> s;
    const char *f = args[0].getstr();
    while(*f)
    {
        int c = *f++;
        if(c == '%')
        {
            int i = *f++;
            if(i >= '1' && i <= '9')
            {
                i -= '0';
                const char *sub = i < numargs ? args[i].getstr() : "";
                while(*sub) s.add(*sub++);
            }
            else s.add(i);
        }
        else s.add(c);
    }
    s.add('\0');
    result(s.getbuf());
}